

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  cmLocalGenerator *lg_00;
  cmMakefile *mf_00;
  TargetTypes targetTypes_00;
  bool bVar1;
  size_type sVar2;
  reference ppcVar3;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *pvVar4;
  reference ppcVar5;
  cmGeneratorTarget *this_00;
  reference ppcVar6;
  mapped_type *ppcVar7;
  uint local_8c;
  uint i_1;
  cmGeneratorTarget *gt;
  cmLocalGenerator *lg;
  __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
  local_60;
  const_iterator j;
  cmMakefile *mf;
  undefined1 local_48 [4];
  uint i;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = targetTypes;
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         *)local_48);
  mf._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::size(&this->Makefiles);
    if (sVar2 <= mf._4_4_) break;
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,(ulong)mf._4_4_);
    j._M_current = (cmTarget **)*ppcVar3;
    pvVar4 = cmMakefile::GetOwnedImportedTargets((cmMakefile *)j._M_current);
    local_60._M_current =
         (cmTarget **)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin(pvVar4);
    while( true ) {
      pvVar4 = cmMakefile::GetOwnedImportedTargets((cmMakefile *)j._M_current);
      lg = (cmLocalGenerator *)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end(pvVar4);
      bVar1 = __gnu_cxx::operator!=
                        (&local_60,
                         (__normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                          *)&lg);
      if (!bVar1) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)mf._4_4_);
      lg_00 = *ppcVar5;
      this_00 = (cmGeneratorTarget *)operator_new(0x500);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                ::operator*(&local_60);
      cmGeneratorTarget::cmGeneratorTarget(this_00,*ppcVar6,lg_00);
      cmLocalGenerator::AddOwnedImportedGeneratorTarget(lg_00,this_00);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                ::operator*(&local_60);
      ppcVar7 = std::
                map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                              *)local_48,ppcVar6);
      *ppcVar7 = this_00;
      __gnu_cxx::
      __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
      operator++(&local_60);
    }
    mf._4_4_ = mf._4_4_ + 1;
  }
  local_8c = 0;
  while( true ) {
    sVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    targetTypes_00 = importedMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    if (sVar2 <= local_8c) break;
    ppcVar3 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        (&this->Makefiles,(ulong)local_8c);
    mf_00 = *ppcVar3;
    ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,(ulong)local_8c);
    CreateGeneratorTargets
              (this,targetTypes_00,mf_00,*ppcVar5,
               (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                *)local_48);
    local_8c = local_8c + 1;
  }
  std::
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~map((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *)local_48);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for(unsigned int i=0; i < this->Makefiles.size(); ++i)
    {
    cmMakefile* mf = this->Makefiles[i];
    for(std::vector<cmTarget*>::const_iterator
          j = mf->GetOwnedImportedTargets().begin();
        j != mf->GetOwnedImportedTargets().end(); ++j)
      {
      cmLocalGenerator* lg = this->LocalGenerators[i];
      cmGeneratorTarget* gt = new cmGeneratorTarget(*j, lg);
      lg->AddOwnedImportedGeneratorTarget(gt);
      importedMap[*j] = gt;
      }
    }

  // Construct per-target generator information.
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i],
                                 this->LocalGenerators[i], importedMap);
    }
}